

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyhanabi.cc
# Opt level: O0

int KnownRank(pyhanabi_card_knowledge_t *knowledge)

{
  int iVar1;
  long *in_RDI;
  
  if (in_RDI == (long *)0x0) {
    __assert_fail("knowledge != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                  ,0x5b,"int KnownRank(pyhanabi_card_knowledge_t *)");
  }
  if (*in_RDI != 0) {
    iVar1 = hanabi_learning_env::HanabiHand::CardKnowledge::Rank((CardKnowledge *)0x135484);
    return iVar1;
  }
  __assert_fail("knowledge->knowledge != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Farama-Foundation[P]hanabi-learning-environment/hanabi_learning_environment/pyhanabi.cc"
                ,0x5c,"int KnownRank(pyhanabi_card_knowledge_t *)");
}

Assistant:

int KnownRank(pyhanabi_card_knowledge_t* knowledge) {
  REQUIRE(knowledge != nullptr);
  REQUIRE(knowledge->knowledge != nullptr);
  return reinterpret_cast<
             const hanabi_learning_env::HanabiHand::CardKnowledge*>(
             knowledge->knowledge)
      ->Rank();
}